

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::inertia::mark_bisection
          (inertia *this,CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> *axis)

{
  int *piVar1;
  CommPtr *pCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Alloc *pAVar4;
  Library *this_00;
  Vector<3> center_00;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Alloc *pAVar8;
  int iVar9;
  Library *pLVar10;
  bool bVar11;
  Int j_3;
  Library **ppLVar12;
  double *pdVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  undefined1 *puVar15;
  int iVar16;
  void **ppvVar17;
  undefined8 uVar18;
  uint uVar19;
  undefined8 *puVar20;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Write<signed_char> *pWVar22;
  undefined8 *puVar23;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var24;
  void **ppvVar25;
  SharedAlloc *pSVar26;
  long lVar27;
  Int i;
  long lVar28;
  Int i_1;
  long lVar29;
  Int i_2;
  long lVar30;
  Reals *pRVar31;
  IntIterator last;
  size_t sVar32;
  Real *result;
  ulong uVar33;
  byte bVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  double dVar37;
  Library *pLVar38;
  ulong uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  Real a;
  Real d;
  Real g;
  Real b;
  Real e;
  Real h;
  Real c_15;
  Real f_1;
  Real i_9;
  Library *pLVar42;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var43;
  double dVar44;
  Library *pLVar45;
  Library *pLVar46;
  double dVar47;
  double dVar48;
  _Base_ptr p_Var49;
  Read<signed_char> RVar50;
  Vector<6> v;
  Vector<3> c_7;
  DiagDecomp<3> ed;
  Vector<3> c;
  Vector<3> c_9;
  Vector<3> n;
  Write<double> weighted_contrib;
  Vector<3> c_5;
  Vector<3> l;
  Vector<3> c_2;
  Vector<3> c_20;
  Vector<3> center;
  Vector<3> c_4;
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  Library *local_538 [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_520;
  Library *local_518;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_510;
  Library *pLStack_508;
  Library *local_500;
  Library *local_4f8;
  _Base_ptr p_Stack_4f0;
  Library *local_4e8 [4];
  Library *local_4c8;
  Library *local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b8;
  Library *apLStack_4b0 [8];
  Alloc *local_470 [3];
  Library *local_458;
  undefined8 uStack_450;
  Read<signed_char> local_448;
  Library *local_438 [7];
  Library *local_400;
  Library *local_3f8;
  Library *local_3f0;
  Library *local_3e8;
  Library *local_3e0;
  Library *local_3d8;
  Library *local_3d0;
  Library *local_3c8;
  Library *local_3c0;
  Library *local_3b8;
  undefined8 uStack_3b0;
  Write<double> local_3a8;
  Library *local_398;
  double dStack_390;
  double local_388;
  Library *local_380;
  Library *local_378;
  Alloc *local_370;
  void *local_368;
  Library *local_358;
  undefined8 uStack_350;
  Library *local_348;
  undefined8 uStack_340;
  Library *local_338;
  _Base_ptr p_Stack_330;
  Library *local_328;
  Library *local_320;
  Alloc *local_318;
  void *local_310;
  Library *local_308 [3];
  double dStack_2f0;
  double local_2e8;
  Library *local_2e0;
  Library *pLStack_2d8;
  Alloc *local_2d0;
  void *pvStack_2c8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  Library *local_298;
  undefined8 uStack_290;
  Alloc *local_288;
  void *local_280;
  Library *local_278;
  Library *local_270;
  Library *local_268;
  Library *local_260;
  Write<double> local_258;
  Library *local_248 [4];
  Library *local_228 [3];
  double dStack_210;
  double local_208;
  Library *local_200;
  Library *local_1f8;
  Alloc *local_1f0;
  void *local_1e8;
  undefined1 local_1d8 [16];
  Reals *local_1c0;
  Vector<3> *local_1b8;
  Real local_1b0;
  Reals local_1a8;
  Reals local_198;
  Library *local_188;
  double dStack_180;
  double local_178;
  Library *local_168;
  undefined8 uStack_160;
  Library *local_158;
  undefined8 uStack_150;
  Alloc *local_148;
  void *local_140;
  Reals local_138;
  Reals local_128;
  CommPtr local_118;
  Reals local_108;
  CommPtr local_f8;
  Library *local_e8 [4];
  Library *local_c8 [4];
  Alloc *local_a8;
  Real local_a0;
  double local_98 [3];
  Vector<3> local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  Library *pLStack_60;
  Library *local_58;
  Library *local_48 [3];
  void *pvVar21;
  
  bVar34 = 0;
  pAVar4 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)pAVar4 & 1) == 0) {
    uVar39 = pAVar4->size;
  }
  else {
    uVar39 = (ulong)pAVar4 >> 3;
  }
  pAVar4 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar4 & 1) == 0) {
    sVar32 = pAVar4->size;
  }
  else {
    sVar32 = (ulong)pAVar4 >> 3;
  }
  local_1b8 = axis;
  if ((int)(sVar32 >> 3) * 3 != (int)(uVar39 >> 3)) {
    fail("assertion %s failed at %s +%d\n","coords.size() == masses.size() * 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
         ,0x91);
  }
  local_f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_108.write_.shared_alloc_.alloc = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108.write_.shared_alloc_.alloc =
           (Alloc *)((local_108.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_108.write_.shared_alloc_.alloc)->use_count =
           (local_108.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_108.write_.shared_alloc_.direct_ptr = (masses->write_).shared_alloc_.direct_ptr;
  local_a0 = tolerance;
  local_1b0 = repro_sum(&local_f8,&local_108);
  pAVar4 = local_108.write_.shared_alloc_.alloc;
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_108.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  if (local_f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_118.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_118.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_118.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_118.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_118.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_118.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_118.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_198.write_.shared_alloc_.alloc = (coords->write_).shared_alloc_.alloc;
  if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198.write_.shared_alloc_.alloc =
           (Alloc *)((local_198.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_198.write_.shared_alloc_.alloc)->use_count =
           (local_198.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_198.write_.shared_alloc_.direct_ptr = (coords->write_).shared_alloc_.direct_ptr;
  local_128.write_.shared_alloc_.alloc = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_128.write_.shared_alloc_.alloc & 7) == 0 &&
      local_128.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128.write_.shared_alloc_.alloc =
           (Alloc *)((local_128.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_128.write_.shared_alloc_.alloc)->use_count =
           (local_128.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_128.write_.shared_alloc_.direct_ptr = (masses->write_).shared_alloc_.direct_ptr;
  anon_unknown_0::get_center(&local_80,&local_118,&local_198,&local_128,local_1b0);
  pAVar4 = local_128.write_.shared_alloc_.alloc;
  if (((ulong)local_128.write_.shared_alloc_.alloc & 7) == 0 &&
      local_128.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_128.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_128.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  pAVar4 = local_198.write_.shared_alloc_.alloc;
  if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_198.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  local_a8 = (Alloc *)this;
  if (local_118.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pLVar42 = (Library *)(comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (Library *)
            (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_00 != (Library *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(this_00->argv_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(this_00->argv_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(this_00->argv_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(this_00->argv_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  local_278 = (Library *)(coords->write_).shared_alloc_.alloc;
  if (((ulong)local_278 & 7) == 0 && local_278 != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_278 = (Library *)(*(size_t *)&local_278->self_send_threshold_ * 8 + 1);
    }
    else {
      *(int *)&(local_278->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_278->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
    }
  }
  local_270 = (Library *)(coords->write_).shared_alloc_.direct_ptr;
  local_288 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_288 = (Alloc *)(local_288->size * 8 + 1);
    }
    else {
      local_288->use_count = local_288->use_count + 1;
    }
  }
  local_310 = (masses->write_).shared_alloc_.direct_ptr;
  local_178 = local_80.super_Few<double,_3>.array_[2];
  local_188 = (Library *)local_80.super_Few<double,_3>.array_[0];
  dStack_180 = local_80.super_Few<double,_3>.array_[1];
  if (this_00 != (Library *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(this_00->argv_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(this_00->argv_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(this_00->argv_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(this_00->argv_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  local_268 = local_278;
  if (((ulong)local_278 & 7) == 0 && local_278 != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_268 = (Library *)(*(size_t *)&local_278->self_send_threshold_ * 8 + 1);
    }
    else {
      *(int *)&(local_278->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_278->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
    }
  }
  local_318 = local_288;
  if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_318 = (Alloc *)(local_288->size * 8 + 1);
    }
    else {
      local_288->use_count = local_288->use_count + 1;
    }
  }
  if (((ulong)local_318 & 1) == 0) {
    sVar32 = local_318->size;
  }
  else {
    sVar32 = (ulong)local_318 >> 3;
  }
  local_558._8_8_ = (Library *)0x0;
  local_548._0_8_ = local_548._0_8_ & 0xffffffffffffff00;
  iVar16 = (int)(sVar32 >> 3);
  local_558._0_8_ = (Library *)local_548;
  local_280 = local_310;
  local_260 = local_270;
  local_1c0 = coords;
  Write<double>::Write(&local_258,iVar16 * 6,(string *)local_558);
  if ((Library *)local_558._0_8_ != (Library *)local_548) {
    operator_delete((void *)local_558._0_8_,(ulong)(local_548._0_8_ + 1));
  }
  local_228[0] = local_268;
  if (((ulong)local_268 & 7) == 0 && local_268 != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_228[0] = (Library *)(*(size_t *)&local_268->self_send_threshold_ * 8 + 1);
    }
    else {
      *(int *)&(local_268->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_268->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
    }
  }
  local_228[1] = local_260;
  local_228[2] = local_188;
  dStack_210 = dStack_180;
  local_208 = local_178;
  local_200 = (Library *)local_258.shared_alloc_.alloc;
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      (Library *)local_258.shared_alloc_.alloc != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_200 = (Library *)((local_258.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&(((CommPtr *)&(local_258.shared_alloc_.alloc)->use_count)->
               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((CommPtr *)&(local_258.shared_alloc_.alloc)->use_count)->
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
    }
  }
  local_1f8 = (Library *)local_258.shared_alloc_.direct_ptr;
  local_1f0 = local_318;
  if (((ulong)local_318 & 7) == 0 && local_318 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f0 = (Alloc *)(local_318->size * 8 + 1);
    }
    else {
      local_318->use_count = local_318->use_count + 1;
    }
  }
  local_1e8 = local_310;
  local_308[0] = local_228[0];
  if (((ulong)local_228[0] & 7) == 0 && local_228[0] != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_308[0] = (Library *)(*(size_t *)&local_228[0]->self_send_threshold_ * 8 + 1);
    }
    else {
      *(int *)&(local_228[0]->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_228[0]->self_).
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  local_308[1] = local_260;
  local_308[2] = local_188;
  dStack_2f0 = dStack_180;
  local_2e8 = local_178;
  local_2e0 = local_200;
  if (((ulong)local_200 & 7) == 0 && local_200 != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_2e0 = (Library *)(*(long *)&local_200->self_send_threshold_ * 8 + 1);
    }
    else {
      *(int *)&(local_200->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_200->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
    }
  }
  pLStack_2d8 = (Library *)local_258.shared_alloc_.direct_ptr;
  local_2d0 = local_1f0;
  if (((ulong)local_1f0 & 7) == 0 && local_1f0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2d0 = (Alloc *)(local_1f0->size * 8 + 1);
    }
    else {
      local_1f0->use_count = local_1f0->use_count + 1;
    }
  }
  pvStack_2c8 = local_310;
  if (0 < iVar16) {
    local_3a8.shared_alloc_.alloc = (Alloc *)local_308[0];
    local_3a8.shared_alloc_.direct_ptr = local_260;
    if (((ulong)local_308[0] & 7) == 0 && local_308[0] != (Library *)0x0) {
      *(int *)&(local_308[0]->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_308[0]->self_).
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + -1;
      local_3a8.shared_alloc_.alloc =
           (Alloc *)(*(size_t *)&local_308[0]->self_send_threshold_ * 8 + 1);
    }
    local_308[0] = (Library *)0x0;
    local_308[1] = (Library *)0x0;
    local_398 = local_188;
    dStack_390 = dStack_180;
    local_388 = local_178;
    local_380 = local_2e0;
    local_378 = (Library *)local_258.shared_alloc_.direct_ptr;
    if (((ulong)local_2e0 & 7) == 0 && local_2e0 != (Library *)0x0) {
      *(int *)&(local_2e0->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_2e0->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + -1;
      local_380 = (Library *)(*(long *)&local_2e0->self_send_threshold_ * 8 + 1);
    }
    local_2e0 = (Library *)0x0;
    pLStack_2d8 = (Library *)0x0;
    local_370 = local_2d0;
    local_368 = local_310;
    if (((ulong)local_2d0 & 7) == 0 && local_2d0 != (Alloc *)0x0) {
      local_2d0->use_count = local_2d0->use_count + -1;
      local_370 = (Alloc *)(local_2d0->size * 8 + 1);
    }
    local_2d0 = (Alloc *)0x0;
    pvStack_2c8 = (void *)0x0;
    entering_parallel = '\0';
    lVar27 = 0;
    do {
      apLStack_4b0[1] =
           (Library *)
           (&local_260->argv_)[lVar27].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_4b8._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            (&local_260->self_send_threshold_ + lVar27 * 6);
      apLStack_4b0[0] =
           (Library *)
           (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(&local_260->self_send_threshold_ + lVar27 * 6 + 2))->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_548._0_8_ = local_178;
      local_558._0_8_ = local_188;
      local_558._8_8_ = dStack_180;
      lVar28 = 0;
      do {
        (&local_448.write_.shared_alloc_.alloc)[lVar28] =
             (Alloc *)((double)(&local_4b8)[lVar28]._M_pi - *(double *)(local_558 + lVar28 * 8));
        local_558._8_8_ = local_438[0];
        local_538[2] = (Library *)local_448.write_.shared_alloc_.direct_ptr;
        local_538[1] = (Library *)local_448.write_.shared_alloc_.alloc;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar37 = *(double *)((long)local_310 + lVar27 * 8);
      local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      apLStack_4b0[1] =
           (Library *)((ulong)local_448.write_.shared_alloc_.direct_ptr ^ 0x8000000000000000);
      apLStack_4b0[2] = (Library *)((ulong)local_438[0] ^ 0x8000000000000000);
      apLStack_4b0[3] = (Library *)0x0;
      apLStack_4b0[4] = (Library *)local_448.write_.shared_alloc_.alloc;
      apLStack_4b0[5] = (Library *)local_448.write_.shared_alloc_.direct_ptr;
      apLStack_4b0[6] =
           (Library *)((ulong)local_448.write_.shared_alloc_.alloc ^ 0x8000000000000000);
      apLStack_4b0[7] = (Library *)0x0;
      lVar28 = 0;
      do {
        local_58 = apLStack_4b0[lVar28 * 3 + 1];
        local_68 = (&local_4b8)[lVar28 * 3]._M_pi;
        pLStack_60 = apLStack_4b0[lVar28 * 3];
        local_558._0_8_ = (Library *)0x0;
        local_548._0_8_ = (ulong)local_538[2] ^ 0x8000000000000000;
        local_548._8_8_ = local_558._8_8_ ^ 0x8000000000000000;
        local_538[0] = (Library *)0x0;
        _Stack_520._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((ulong)local_538[1] ^ 0x8000000000000000);
        local_518 = (Library *)0x0;
        local_4e8[2] = (Library *)local_548._0_8_;
        local_4e8[0] = (Library *)0x0;
        local_4e8[1] = (Library *)local_558._8_8_;
        lVar29 = 0;
        do {
          local_e8[lVar29] = (Library *)((double)local_4e8[lVar29] * (double)local_68);
          lVar29 = lVar29 + 1;
        } while (lVar29 != 3);
        lVar29 = 1;
        do {
          local_4e8[2] = (Library *)*(undefined8 *)(local_548 + lVar29 * 0x18);
          local_4e8[0] = *(Library **)(local_558 + lVar29 * 0x18);
          local_4e8[1] = (Library *)*(size_t *)(local_548 + lVar29 * 0x18 + -8);
          p_Var3 = (&local_68)[lVar29];
          lVar30 = 0;
          do {
            local_48[lVar30] = (Library *)((double)local_4e8[lVar30] * (double)p_Var3);
            lVar30 = lVar30 + 1;
          } while (lVar30 != 3);
          local_4e8[2] = local_48[2];
          local_4e8[0] = local_48[0];
          local_4e8[1] = local_48[1];
          local_c8[0] = local_e8[0];
          local_c8[1] = local_e8[1];
          local_c8[2] = local_e8[2];
          lVar30 = 0;
          do {
            local_248[lVar30] = (Library *)((double)local_c8[lVar30] + (double)local_4e8[lVar30]);
            lVar30 = lVar30 + 1;
          } while (lVar30 != 3);
          local_e8[0] = local_248[0];
          local_e8[1] = local_248[1];
          local_e8[2] = local_248[2];
          lVar29 = lVar29 + 1;
        } while (lVar29 != 3);
        *(Library **)((long)&local_448 + lVar28 * 0x18) = local_248[0];
        local_438[lVar28 * 3 + -1] = local_248[1];
        local_438[lVar28 * 3] = local_248[2];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        apLStack_4b0[1] = local_438[lVar28 * 3];
        local_4b8._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_448 + lVar28 * 0x18);
        apLStack_4b0[0] = local_438[lVar28 * 3 + -1];
        lVar29 = 0;
        do {
          local_4e8[lVar29] = (Library *)((double)(&local_4b8)[lVar29]._M_pi * -dVar37);
          lVar29 = lVar29 + 1;
        } while (lVar29 != 3);
        *(Library **)(local_558 + lVar28 * 0x18) = local_4e8[0];
        *(Library **)(local_548 + lVar28 * 0x18 + -8) = local_4e8[1];
        *(Library **)(local_548 + lVar28 * 0x18) = local_4e8[2];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      *(undefined8 *)((LO *)local_258.shared_alloc_.direct_ptr + lVar27 * 0xc) = local_558._0_8_;
      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)((long)local_258.shared_alloc_.direct_ptr + 8))[lVar27 * 2].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_538[0];
      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)((long)local_258.shared_alloc_.direct_ptr + 8))[lVar27 * 2].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_518;
      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)((long)local_258.shared_alloc_.direct_ptr + 8))[lVar27 * 2].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_548._8_8_;
      ((CommPtr *)((long)local_258.shared_alloc_.direct_ptr + 0x20))[lVar27 * 3].
      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Stack_520._M_pi;
      ((CommPtr *)((long)local_258.shared_alloc_.direct_ptr + 0x20))[lVar27 * 3].
      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538[2];
      lVar27 = lVar27 + 1;
    } while ((int)lVar27 != iVar16);
    (anonymous_namespace)::
    get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)
    ::$_0::~__0((__0 *)&local_3a8);
  }
  (anonymous_namespace)::
  get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)
  ::$_0::~__0((__0 *)local_308);
  if (this_00 != (Library *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(this_00->argv_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(this_00->argv_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(this_00->argv_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(this_00->argv_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  local_3a8.shared_alloc_.alloc = local_258.shared_alloc_.alloc;
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      (Library *)local_258.shared_alloc_.alloc != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_3a8.shared_alloc_.alloc = (Alloc *)((local_258.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&(((CommPtr *)&(local_258.shared_alloc_.alloc)->use_count)->
               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((CommPtr *)&(local_258.shared_alloc_.alloc)->use_count)->
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
    }
  }
  local_3a8.shared_alloc_.direct_ptr = local_258.shared_alloc_.direct_ptr;
  local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar42;
  apLStack_4b0[0] = this_00;
  Read<double>::Read(&local_448,&local_3a8);
  p_Var14 = &local_4b8;
  result = (Real *)local_558;
  repro_sum((CommPtr *)p_Var14,(Reals *)&local_448,6,result);
  pAVar4 = local_448.write_.shared_alloc_.alloc;
  if (((ulong)local_448.write_.shared_alloc_.alloc & 7) == 0 &&
      (Library *)local_448.write_.shared_alloc_.alloc != (Library *)0x0) {
    pCVar2 = (CommPtr *)&(local_448.write_.shared_alloc_.alloc)->use_count;
    *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         -1;
    if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == 0
       ) {
      Alloc::~Alloc(local_448.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  pAVar4 = local_3a8.shared_alloc_.alloc;
  if (((ulong)local_3a8.shared_alloc_.alloc & 7) == 0 &&
      (Library *)local_3a8.shared_alloc_.alloc != (Library *)0x0) {
    pCVar2 = (CommPtr *)&(local_3a8.shared_alloc_.alloc)->use_count;
    *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         -1;
    if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == 0
       ) {
      Alloc::~Alloc(local_3a8.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  if (apLStack_4b0[0] != (Library *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apLStack_4b0[0]);
  }
  pLVar45 = local_538[1];
  pLVar42 = local_538[0];
  uVar18 = local_548._0_8_;
  local_458 = (Library *)local_558._0_8_;
  local_4f8 = (Library *)local_558._8_8_;
  local_3b8 = (Library *)local_548._8_8_;
  (anonymous_namespace)::
  get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)
  ::$_0::~__0((__0 *)local_228);
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      (Library *)local_258.shared_alloc_.alloc != (Library *)0x0) {
    pCVar2 = (CommPtr *)&(local_258.shared_alloc_.alloc)->use_count;
    *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         -1;
    if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == 0
       ) {
      Alloc::~Alloc(local_258.shared_alloc_.alloc);
      operator_delete(local_258.shared_alloc_.alloc,0x48);
    }
  }
  pAVar4 = local_318;
  if (((ulong)local_318 & 7) == 0 && local_318 != (Alloc *)0x0) {
    piVar1 = &local_318->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_318);
      operator_delete(pAVar4,0x48);
    }
  }
  pLVar46 = local_268;
  if (((ulong)local_268 & 7) == 0 && local_268 != (Library *)0x0) {
    pCVar2 = &local_268->self_;
    *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         -1;
    if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == 0
       ) {
      Alloc::~Alloc((Alloc *)local_268);
      operator_delete(pLVar46,0x48);
    }
  }
  if (this_00 != (Library *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  pRVar31 = local_1c0;
  local_558._0_8_ = local_458;
  local_558._8_8_ = local_3b8;
  local_548._0_8_ = local_538[1];
  local_548._8_8_ = local_3b8;
  local_538[0] = local_4f8;
  local_538[1] = pLVar42;
  local_538[2] = pLVar45;
  _Stack_520._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar42;
  local_518 = (Library *)uVar18;
  dVar37 = 0.0;
  lVar27 = 0;
  do {
    lVar28 = 0;
    dVar47 = dVar37;
    do {
      dVar37 = ABS(result[lVar28]);
      if (ABS(result[lVar28]) <= dVar47) {
        dVar37 = dVar47;
      }
      lVar28 = lVar28 + 1;
      dVar47 = dVar37;
    } while (lVar28 != 3);
    lVar27 = lVar27 + 1;
    result = result + 3;
  } while (lVar27 != 3);
  if (dVar37 <= 1e-10) {
    lVar27 = 0;
    do {
      lVar28 = 0;
      do {
        lVar29 = 0x3ff00000;
        if (lVar27 != lVar28) {
          lVar29 = 0;
        }
        p_Var14[lVar28]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar29 << 0x20);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar27 = lVar27 + 1;
      p_Var14 = p_Var14 + 3;
    } while (lVar27 != 3);
    local_470[0] = (Alloc *)0x0;
    local_470[1] = (Alloc *)0x0;
    local_470[2] = (Alloc *)0x0;
    goto LAB_002e7e28;
  }
  local_548._0_8_ = pLVar45;
  lVar27 = 0;
  do {
    local_438[0] = *(Library **)(local_548 + lVar27 * 0x18);
    local_448.write_.shared_alloc_.alloc = (Alloc *)*(Library **)(local_558 + lVar27 * 0x18);
    local_448.write_.shared_alloc_.direct_ptr = *(Library **)(local_548 + lVar27 * 0x18 + -8);
    lVar28 = 0;
    do {
      (&local_3a8.shared_alloc_.alloc)[lVar28] =
           (Alloc *)((double)(&local_448.write_.shared_alloc_.alloc)[lVar28] / dVar37);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    (&local_4b8)[lVar27 * 3]._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8.shared_alloc_.alloc;
    local_3c0 = (Library *)local_4b8._M_pi;
    apLStack_4b0[lVar27 * 3] = (Library *)local_3a8.shared_alloc_.direct_ptr;
    local_3c8 = apLStack_4b0[0];
    apLStack_4b0[lVar27 * 3 + 1] = local_398;
    local_400 = apLStack_4b0[7];
    local_3f8 = apLStack_4b0[6];
    local_3f0 = apLStack_4b0[5];
    local_3e8 = apLStack_4b0[4];
    local_3e0 = apLStack_4b0[3];
    local_3d8 = apLStack_4b0[2];
    local_3d0 = apLStack_4b0[1];
    lVar27 = lVar27 + 1;
  } while (lVar27 != 3);
  ppLVar12 = local_538;
  local_558._0_8_ = local_4b8._M_pi;
  local_558._8_8_ = apLStack_4b0[0];
  local_548._0_8_ = apLStack_4b0[1];
  local_548._8_8_ = apLStack_4b0[2];
  local_538[0] = apLStack_4b0[3];
  local_538[1] = apLStack_4b0[4];
  local_538[2] = apLStack_4b0[5];
  _Stack_520._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apLStack_4b0[6];
  local_518 = apLStack_4b0[7];
  lVar27 = 0x18;
  _Var43._M_pi = local_4b8._M_pi;
  do {
    _Var43._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (_Var43._M_pi + (double)*ppLVar12);
    lVar27 = lVar27 + 0x18;
    ppLVar12 = ppLVar12 + 4;
  } while (lVar27 != 0x48);
  lVar27 = 0;
  do {
    local_c8[2] = apLStack_4b0[lVar27 * 3 + 1];
    local_c8[0] = (Library *)(&local_4b8)[lVar27 * 3]._M_pi;
    local_c8[1] = apLStack_4b0[lVar27 * 3];
    local_558._0_8_ = local_3c0;
    local_558._8_8_ = local_3c8;
    local_548._0_8_ = local_3d0;
    local_548._8_8_ = local_3d8;
    local_538[0] = local_3e0;
    local_538[1] = local_3e8;
    local_538[2] = local_3f0;
    _Stack_520._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8;
    local_518 = local_400;
    local_398 = local_3d0;
    local_3a8.shared_alloc_.alloc = (Alloc *)local_3c0;
    local_3a8.shared_alloc_.direct_ptr = local_3c8;
    lVar28 = 0;
    do {
      local_248[lVar28] =
           (Library *)((double)(&local_3a8.shared_alloc_.alloc)[lVar28] * (double)local_c8[0]);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 1;
    do {
      local_398 = *(Library **)(local_548 + lVar28 * 0x18);
      local_3a8.shared_alloc_.alloc = *(Alloc **)(local_558 + lVar28 * 0x18);
      local_3a8.shared_alloc_.direct_ptr = *(void **)(local_548 + lVar28 * 0x18 + -8);
      pLVar42 = local_c8[lVar28];
      lVar29 = 0;
      do {
        local_4e8[lVar29] =
             (Library *)((double)(&local_3a8.shared_alloc_.alloc)[lVar29] * (double)pLVar42);
        lVar29 = lVar29 + 1;
      } while (lVar29 != 3);
      local_398 = local_4e8[2];
      local_3a8.shared_alloc_.alloc = (Alloc *)local_4e8[0];
      local_3a8.shared_alloc_.direct_ptr = local_4e8[1];
      local_308[0] = local_248[0];
      local_308[1] = local_248[1];
      local_308[2] = local_248[2];
      lVar29 = 0;
      do {
        local_228[lVar29] =
             (Library *)
             ((double)local_308[lVar29] + (double)(&local_3a8.shared_alloc_.alloc)[lVar29]);
        lVar29 = lVar29 + 1;
      } while (lVar29 != 3);
      local_248[0] = local_228[0];
      local_248[1] = local_228[1];
      local_248[2] = local_228[2];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    *(Library **)((long)&local_448 + lVar27 * 0x18) = local_228[0];
    local_438[lVar27 * 3 + -1] = local_228[1];
    local_438[lVar27 * 3] = local_228[2];
    lVar27 = lVar27 + 1;
  } while (lVar27 != 3);
  local_2b8 = dVar37;
  uStack_2b0 = 0;
  ppvVar17 = (void **)&local_448;
  pWVar22 = (Write<signed_char> *)ppvVar17;
  pdVar13 = (double *)local_558;
  for (lVar27 = 9; lVar27 != 0; lVar27 = lVar27 + -1) {
    *pdVar13 = *(double *)pWVar22;
    pWVar22 = (Write<signed_char> *)((long)pWVar22 + ((ulong)bVar34 * 0xfffffffffffffffe + 1) * 8);
    pdVar13 = pdVar13 + (ulong)bVar34 * -2 + 1;
  }
  lVar27 = 0x18;
  ppLVar12 = local_538;
  pLVar42 = (Library *)local_558._0_8_;
  do {
    pLVar42 = (Library *)((double)pLVar42 + (double)*ppLVar12);
    lVar27 = lVar27 + 0x18;
    ppLVar12 = ppLVar12 + 4;
  } while (lVar27 != 0x48);
  dVar47 = (double)_Var43._M_pi * (double)_Var43._M_pi;
  dVar37 = (dVar47 - (double)pLVar42) * 0.5;
  p_Var49 = (_Base_ptr)(((dVar37 * 3.0 - dVar47) / 3.0) / 3.0);
  dVar48 = ((dVar47 * (double)_Var43._M_pi + dVar47 * (double)_Var43._M_pi +
            dVar37 * -9.0 * (double)_Var43._M_pi +
            (((((double)local_3c8 * (double)local_3f0 * (double)local_3e8 +
               (double)local_3c0 * (double)local_3e0 * (double)local_400 +
               (double)local_3d8 * (double)local_3f8 * (double)local_3d0) -
              (double)local_3e0 * (double)local_3f0 * (double)local_3d0) -
             (double)local_3c8 * (double)local_3d8 * (double)local_400) -
            (double)local_3f8 * (double)local_3c0 * (double)local_3e8) * 27.0) / 27.0) * 0.5;
  dVar47 = (double)p_Var49 * (double)p_Var49 * (double)p_Var49;
  dVar37 = dVar48 * dVar48 + dVar47;
  dVar44 = (double)_Var43._M_pi / 3.0;
  if (0.0 <= dVar37) {
    pLVar42 = (Library *)SQRT(dVar37);
    local_458 = pLVar42;
    if (0.0 > dVar37) {
      pLVar42 = (Library *)sqrt(dVar37);
    }
    local_4f8 = (Library *)cbrt((double)pLVar42 + dVar48);
    pLVar42 = local_458;
    if (dVar37 < 0.0) {
      pLVar42 = (Library *)sqrt(dVar37);
    }
    dVar37 = cbrt(dVar48 - (double)pLVar42);
    pLVar42 = (Library *)(dVar44 + (double)local_4f8 + dVar37);
    pLVar45 = (Library *)(((double)local_4f8 + dVar37) * -0.5 + dVar44);
    local_228[2] = pLVar45;
  }
  else {
    p_Stack_4f0 = (_Base_ptr)0x0;
    local_4f8 = (Library *)p_Var49;
    if (-0.0 < dVar47) {
      dVar37 = sqrt(-dVar47);
    }
    else {
      dVar37 = SQRT(-dVar47);
    }
    dVar47 = -1.0;
    if (-1.0 <= dVar48 / dVar37) {
      dVar47 = dVar48 / dVar37;
    }
    uVar35 = 0;
    uVar36 = 0x3ff00000;
    if (dVar47 <= 1.0) {
      uVar35 = SUB84(dVar47,0);
      uVar36 = (undefined4)((ulong)dVar47 >> 0x20);
    }
    dVar37 = acos((double)CONCAT44(uVar36,uVar35));
    if (-0.0 < (double)local_4f8) {
      dVar47 = sqrt(-(double)local_4f8);
    }
    else {
      dVar47 = SQRT(-(double)local_4f8);
    }
    dVar47 = dVar47 + dVar47;
    dVar48 = cos(dVar37 / 3.0);
    local_458 = (Library *)(dVar48 * dVar47 + dVar44);
    dVar48 = cos((dVar37 + 6.283185307179586) / 3.0);
    local_4f8 = (Library *)(dVar48 * dVar47 + dVar44);
    dVar37 = cos((dVar37 + -6.283185307179586) / 3.0);
    pLVar45 = local_4f8;
    pLVar42 = local_458;
    local_228[2] = (Library *)(dVar37 * dVar47 + dVar44);
  }
  uVar35 = SUB84(local_3e8,0);
  uVar36 = (undefined4)((ulong)local_3e8 >> 0x20);
  pLVar46 = pLVar45;
  pLVar38 = local_228[2];
  pLVar10 = pLVar42;
  if (((ABS((double)pLVar42 - (double)pLVar45) < 5e-05) ||
      (pLVar46 = pLVar42, pLVar38 = pLVar45, pLVar10 = local_228[2],
      ABS((double)pLVar42 - (double)local_228[2]) < 5e-05)) ||
     (pLVar46 = pLVar45, pLVar38 = pLVar42, ABS((double)pLVar45 - (double)local_228[2]) < 5e-05)) {
    local_228[2] = pLVar10;
    pLVar45 = (Library *)(((double)pLVar46 + (double)local_228[2]) * 0.5);
    dVar37 = (double)pLVar38 - (double)pLVar45;
    if (5e-05 <= ABS(dVar37)) {
      iVar16 = 2;
    }
    else {
      pLVar38 = (Library *)
                ((double)pLVar38 * 0.3333333333333333 + (double)pLVar45 * 0.6666666666666666);
      iVar16 = 1;
    }
    bVar11 = ABS(dVar37) < 5e-05;
    bVar5 = true;
    pLVar42 = pLVar38;
  }
  else {
    iVar16 = 3;
    bVar11 = false;
    bVar5 = false;
  }
  uVar40 = (undefined4)local_2b8;
  uVar41 = local_2b8._4_4_;
  local_228[0] = pLVar42;
  local_228[1] = pLVar45;
  if (iVar16 == 1) {
LAB_002e6fed:
    if (!bVar11) {
      uVar18 = 0xff;
      local_4c8 = (Library *)0x45509d;
LAB_002e818a:
      fail("assertion %s failed at %s +%d\n",local_4c8,
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
           ,uVar18);
    }
    local_4e8[2] = pLVar42;
    local_4e8[1] = pLVar42;
    local_4e8[0] = pLVar42;
    puVar15 = local_558;
    lVar27 = 0;
    do {
      lVar28 = 0;
      do {
        lVar29 = 0x3ff00000;
        if (lVar27 != lVar28) {
          lVar29 = 0;
        }
        *(long *)(puVar15 + lVar28 * 8) = lVar29 << 0x20;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar27 = lVar27 + 1;
      puVar15 = puVar15 + 0x18;
    } while (lVar27 != 3);
    lVar27 = 9;
    puVar20 = (undefined8 *)local_558;
    pSVar26 = &local_3a8.shared_alloc_;
    for (; lVar27 != 0; lVar27 = lVar27 + -1) {
      pSVar26->alloc = *puVar20;
      puVar20 = puVar20 + (ulong)bVar34 * -2 + 1;
      pSVar26 = (SharedAlloc *)((long)pSVar26 + ((ulong)bVar34 * 0xfffffffffffffffe + 1) * 8);
    }
  }
  else if (iVar16 == 2) {
    if (!bVar5) goto LAB_002e6fed;
    pdVar13 = (double *)local_558;
    local_558._0_8_ = local_3c0;
    local_558._8_8_ = local_3c8;
    local_548._0_8_ = local_3d0;
    local_548._8_8_ = local_3d8;
    local_538[0] = local_3e0;
    local_538[1] = local_3e8;
    local_538[2] = local_3f0;
    _Stack_520._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8;
    local_518 = local_400;
    lVar27 = 0;
    do {
      *pdVar13 = *pdVar13 - (double)pLVar42;
      lVar27 = lVar27 + 0x18;
      pdVar13 = pdVar13 + 4;
    } while (lVar27 != 0x48);
    p_Var14 = &local_4b8;
    puVar20 = (undefined8 *)local_558;
    puVar23 = puVar20;
    p_Var24 = p_Var14;
    for (lVar27 = 9; lVar27 != 0; lVar27 = lVar27 + -1) {
      p_Var24->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar23;
      puVar23 = puVar23 + (ulong)bVar34 * -2 + 1;
      p_Var24 = p_Var24 + (ulong)bVar34 * -2 + 1;
    }
    lVar27 = 0;
    do {
      lVar28 = 0;
      p_Var24 = p_Var14;
      do {
        puVar20[lVar28] = p_Var24->_M_pi;
        uVar7 = local_548._0_8_;
        uVar6 = local_558._8_8_;
        uVar18 = local_558._0_8_;
        lVar28 = lVar28 + 1;
        p_Var24 = p_Var24 + 3;
      } while (lVar28 != 3);
      lVar27 = lVar27 + 1;
      puVar20 = puVar20 + 3;
      p_Var14 = p_Var14 + 1;
    } while (lVar27 != 3);
    uVar39 = (ulong)DAT_004511c0;
    local_4b8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((double)local_558._8_8_ * (double)local_538[1] -
         (double)local_538[0] * (double)local_548._0_8_);
    local_3b8 = local_538[1];
    apLStack_4b0[0] =
         (Library *)
         ((double)local_548._0_8_ * (double)local_548._8_8_ -
         (double)local_538[1] * (double)local_558._0_8_);
    apLStack_4b0[1] =
         (Library *)
         ((double)local_558._0_8_ * (double)local_538[0] -
         (double)local_548._8_8_ * (double)local_558._8_8_);
    local_448.write_.shared_alloc_.alloc = (Alloc *)local_4b8._M_pi;
    local_448.write_.shared_alloc_.direct_ptr = apLStack_4b0[0];
    local_438[0] = apLStack_4b0[1];
    dVar37 = (double)local_4b8._M_pi * (double)local_4b8._M_pi;
    lVar27 = 1;
    do {
      dVar37 = dVar37 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar27] *
                        (double)(&local_4b8)[lVar27]._M_pi;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_4f8 = pLVar45;
    local_458 = pLVar42;
    local_338 = (Library *)local_4b8._M_pi;
    p_Stack_330 = (_Base_ptr)0x0;
    local_348 = apLStack_4b0[0];
    uStack_340 = 0;
    local_358 = apLStack_4b0[1];
    uStack_350 = 0;
    local_1d8._8_4_ = DAT_004511c0._8_4_;
    local_1d8._0_8_ = local_548._0_8_ ^ uVar39;
    local_1d8._12_4_ = DAT_004511c0._12_4_;
    local_158 = (Library *)(local_558._0_8_ ^ uVar39);
    uStack_150 = DAT_004511c0._8_8_;
    local_168 = (Library *)(local_558._8_8_ ^ uVar39);
    uStack_160 = DAT_004511c0._8_8_;
    if (dVar37 < 0.0) {
      local_4c0 = (Library *)local_548._8_8_;
      local_298 = local_538[0];
      dVar37 = sqrt(dVar37);
    }
    else {
      dVar37 = SQRT(dVar37);
      local_4c0 = (Library *)local_548._8_8_;
      local_298 = local_538[0];
    }
    local_4b8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((double)local_298 * (double)local_518 - (double)_Stack_520._M_pi * (double)local_3b8);
    apLStack_4b0[0] =
         (Library *)
         ((double)local_3b8 * (double)local_538[2] - (double)local_518 * (double)local_4c0);
    apLStack_4b0[1] =
         (Library *)
         ((double)local_4c0 * (double)_Stack_520._M_pi - (double)local_538[2] * (double)local_298);
    local_448.write_.shared_alloc_.alloc = (Alloc *)local_4b8._M_pi;
    local_448.write_.shared_alloc_.direct_ptr = apLStack_4b0[0];
    local_438[0] = apLStack_4b0[1];
    dVar47 = (double)local_4b8._M_pi * (double)local_4b8._M_pi;
    lVar27 = 1;
    do {
      dVar47 = dVar47 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar27] *
                        (double)(&local_4b8)[lVar27]._M_pi;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_298 = (Library *)local_4b8._M_pi;
    local_4c0 = apLStack_4b0[1];
    if (dVar47 < 0.0) {
      local_320 = (Library *)_Stack_520._M_pi;
      local_328 = local_538[2];
      local_4c8 = local_518;
      local_3b8 = apLStack_4b0[0];
      local_2a8 = dVar37;
      dVar47 = sqrt(dVar47);
      apLStack_4b0[0] = local_3b8;
      _Var43._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320;
      pLVar42 = local_328;
      pLVar45 = local_4c8;
      dVar37 = local_2a8;
    }
    else {
      dVar47 = SQRT(dVar47);
      _Var43._M_pi = _Stack_520._M_pi;
      pLVar42 = local_538[2];
      pLVar45 = local_518;
    }
    if (dVar37 < dVar47) {
      local_338 = local_298;
      p_Stack_330 = (_Base_ptr)0x0;
      local_348 = apLStack_4b0[0];
      uStack_340 = 0;
      local_358 = local_4c0;
      uStack_350 = 0;
      dVar37 = dVar47;
    }
    pLVar46 = (Library *)
              ((double)uVar6 * (double)pLVar45 + (double)local_1d8._0_8_ * (double)_Var43._M_pi);
    pLVar45 = (Library *)((double)uVar7 * (double)pLVar42 + (double)local_158 * (double)pLVar45);
    pLVar42 = (Library *)
              ((double)uVar18 * (double)_Var43._M_pi + (double)local_168 * (double)pLVar42);
    local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar46;
    apLStack_4b0[0] = pLVar45;
    apLStack_4b0[1] = pLVar42;
    local_448.write_.shared_alloc_.alloc = (Alloc *)pLVar46;
    local_448.write_.shared_alloc_.direct_ptr = pLVar45;
    local_438[0] = pLVar42;
    dVar47 = (double)pLVar46 * (double)pLVar46;
    lVar27 = 1;
    do {
      dVar47 = dVar47 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar27] *
                        (double)(&local_4b8)[lVar27]._M_pi;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    if (dVar47 < 0.0) {
      local_2a8 = dVar37;
      dVar47 = sqrt(dVar47);
      dVar37 = local_2a8;
    }
    else {
      dVar47 = SQRT(dVar47);
    }
    if (dVar37 < dVar47) {
      local_338 = pLVar46;
      p_Stack_330 = (_Base_ptr)0x0;
      local_348 = pLVar45;
      uStack_340 = 0;
      local_358 = pLVar42;
      uStack_350 = 0;
      dVar37 = dVar47;
    }
    if (dVar37 <= 1e-10) {
      uVar18 = 0xbf;
      local_4c8 = (Library *)0x45511a;
      goto LAB_002e818a;
    }
    local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338;
    apLStack_4b0[0] = local_348;
    apLStack_4b0[1] = local_358;
    lVar27 = 0;
    do {
      (&local_448.write_.shared_alloc_.alloc)[lVar27] =
           (Alloc *)((double)(&local_4b8)[lVar27]._M_pi / dVar37);
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_3a8.shared_alloc_.alloc = local_448.write_.shared_alloc_.alloc;
    local_3a8.shared_alloc_.direct_ptr = local_448.write_.shared_alloc_.direct_ptr;
    local_398 = local_438[0];
    local_4e8[0] = local_458;
    local_448.write_.shared_alloc_.alloc = (Alloc *)local_3c0;
    local_448.write_.shared_alloc_.direct_ptr = local_3c8;
    local_438[0] = local_3d0;
    local_438[1] = local_3d8;
    local_438[2] = local_3e0;
    local_438[3] = local_3e8;
    local_438[4] = local_3f0;
    local_438[5] = local_3f8;
    local_438[6] = local_400;
    lVar27 = 0;
    do {
      *ppvVar17 = (void *)((double)*ppvVar17 - (double)local_4f8);
      lVar27 = lVar27 + 0x18;
      ppvVar17 = ppvVar17 + 4;
    } while (lVar27 != 0x48);
    puVar15 = local_558;
    ppvVar17 = (void **)&local_448;
    lVar27 = 0;
    do {
      lVar28 = 0;
      ppvVar25 = ppvVar17;
      do {
        *(void **)(puVar15 + lVar28 * 8) = *ppvVar25;
        lVar28 = lVar28 + 1;
        ppvVar25 = ppvVar25 + 3;
      } while (lVar28 != 3);
      lVar27 = lVar27 + 1;
      puVar15 = puVar15 + 0x18;
      ppvVar17 = ppvVar17 + 1;
    } while (lVar27 != 3);
    apLStack_4b0[1] = (Library *)local_548._0_8_;
    local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._0_8_;
    apLStack_4b0[0] = (Library *)local_558._8_8_;
    local_308[0] = (Library *)local_558._0_8_;
    local_308[1] = (Library *)local_558._8_8_;
    local_308[2] = (Library *)local_548._0_8_;
    dVar37 = (double)local_558._0_8_ * (double)local_558._0_8_;
    lVar27 = 1;
    do {
      dVar37 = dVar37 + (double)local_308[lVar27] * (double)(&local_4b8)[lVar27]._M_pi;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    if (dVar37 < 0.0) {
      dVar37 = sqrt(dVar37);
    }
    else {
      dVar37 = SQRT(dVar37);
    }
    uVar39 = 0;
    uVar33 = 1;
    do {
      apLStack_4b0[1] = *(Library **)(local_548 + uVar33 * 0x18);
      local_4b8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(Library **)(local_558 + uVar33 * 0x18);
      apLStack_4b0[0] = *(Library **)(local_548 + uVar33 * 0x18 + -8);
      local_308[0] = *(Library **)(local_558 + uVar33 * 0x18);
      local_308[1] = *(Library **)(local_548 + uVar33 * 0x18 + -8);
      local_308[2] = *(Library **)(local_548 + uVar33 * 0x18);
      dVar47 = (double)*(Library **)(local_558 + uVar33 * 0x18) *
               (double)*(Library **)(local_558 + uVar33 * 0x18);
      lVar27 = 1;
      do {
        dVar47 = dVar47 + (double)local_308[lVar27] * (double)(&local_4b8)[lVar27]._M_pi;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 3);
      if (dVar47 < 0.0) {
        dVar47 = sqrt(dVar47);
      }
      else {
        dVar47 = SQRT(dVar47);
      }
      if (dVar37 < dVar47) {
        uVar39 = uVar33 & 0xffffffff;
        dVar37 = dVar47;
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != 3);
    if (dVar37 <= 1e-10) {
      uVar18 = 0xd3;
      local_4c8 = (Library *)0x45512b;
      goto LAB_002e818a;
    }
    apLStack_4b0[1] = *(Library **)(local_548 + (long)(int)uVar39 * 0x18);
    lVar27 = (long)(int)uVar39 * 0x18;
    local_4b8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(Library **)(local_558 + lVar27);
    apLStack_4b0[0] = *(Library **)(local_548 + lVar27 + -8);
    lVar27 = 0;
    do {
      local_308[lVar27] = (Library *)((double)(&local_4b8)[lVar27]._M_pi / dVar37);
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    dVar37 = (double)((ulong)local_308[2] & 0x8000000000000000 | (ulong)DAT_00454ff0);
    dVar47 = -1.0 / ((double)local_308[2] + dVar37);
    local_378 = (Library *)((double)local_308[0] * (double)local_308[1] * dVar47);
    dStack_390 = (double)local_308[0] * dVar37 * (double)local_308[0] * dVar47 + 1.0;
    local_388 = dVar37 * (double)local_378;
    local_380 = (Library *)(-dVar37 * (double)local_308[0]);
    local_370 = (Alloc *)((double)local_308[1] * (double)local_308[1] * dVar47 + dVar37);
    local_368 = (void *)((ulong)local_308[1] ^ 0x8000000000000000);
    local_4e8[2] = local_228[1];
    local_4e8[1] = local_228[1];
    uVar40 = (undefined4)local_2b8;
    uVar41 = local_2b8._4_4_;
  }
  else {
    lVar27 = 0;
    local_4c8 = (Library *)0x45511a;
    do {
      pLVar42 = local_228[lVar27];
      local_558._0_8_ = local_3c0;
      local_558._8_8_ = local_3c8;
      local_548._0_8_ = local_3d0;
      local_548._8_8_ = local_3d8;
      local_538[0] = local_3e0;
      local_538[1] = (Library *)CONCAT44(uVar36,uVar35);
      local_538[2] = local_3f0;
      _Stack_520._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8;
      local_518 = local_400;
      lVar28 = 0;
      pdVar13 = (double *)local_558;
      do {
        *pdVar13 = *pdVar13 - (double)pLVar42;
        lVar28 = lVar28 + 0x18;
        pdVar13 = pdVar13 + 4;
      } while (lVar28 != 0x48);
      pdVar13 = (double *)local_558;
      p_Var14 = &local_4b8;
      for (lVar28 = 9; lVar28 != 0; lVar28 = lVar28 + -1) {
        p_Var14->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pdVar13;
        pdVar13 = pdVar13 + (ulong)bVar34 * -2 + 1;
        p_Var14 = p_Var14 + (ulong)bVar34 * -2 + 1;
      }
      lVar28 = 0;
      p_Var14 = &local_4b8;
      pdVar13 = (double *)local_558;
      do {
        lVar29 = 0;
        p_Var24 = p_Var14;
        do {
          pdVar13[lVar29] = (double)p_Var24->_M_pi;
          uVar6 = local_548._0_8_;
          uVar18 = local_558._8_8_;
          lVar29 = lVar29 + 1;
          p_Var24 = p_Var24 + 3;
        } while (lVar29 != 3);
        lVar28 = lVar28 + 1;
        pdVar13 = pdVar13 + 3;
        p_Var14 = p_Var14 + 1;
      } while (lVar28 != 3);
      local_4b8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((double)local_558._8_8_ * (double)local_538[1] -
           (double)local_538[0] * (double)local_548._0_8_);
      apLStack_4b0[0] =
           (Library *)
           ((double)local_548._0_8_ * (double)local_548._8_8_ -
           (double)local_538[1] * (double)local_558._0_8_);
      apLStack_4b0[1] =
           (Library *)
           ((double)local_558._0_8_ * (double)local_538[0] -
           (double)local_548._8_8_ * (double)local_558._8_8_);
      local_448.write_.shared_alloc_.alloc = (Alloc *)local_4b8._M_pi;
      local_448.write_.shared_alloc_.direct_ptr = apLStack_4b0[0];
      local_438[0] = apLStack_4b0[1];
      dVar37 = (double)local_4b8._M_pi * (double)local_4b8._M_pi;
      lVar28 = 1;
      do {
        dVar37 = dVar37 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar28] *
                          (double)(&local_4b8)[lVar28]._M_pi;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158 = pLVar42;
      local_4f8 = (Library *)local_558._0_8_;
      p_Stack_4f0 = (_Base_ptr)0x0;
      local_458 = (Library *)local_4b8._M_pi;
      uStack_450 = 0;
      local_3b8 = apLStack_4b0[0];
      uStack_3b0 = 0;
      local_338 = apLStack_4b0[1];
      p_Stack_330 = (_Base_ptr)0x0;
      local_298 = (Library *)(local_548._0_8_ ^ 0x8000000000000000);
      uStack_290 = 0x8000000000000000;
      local_2a8 = -(double)local_558._0_8_;
      uStack_2a0 = 0x8000000000000000;
      local_1d8._8_8_ = 0x8000000000000000;
      local_1d8._0_8_ = local_558._8_8_ ^ 0x8000000000000000;
      if (dVar37 < 0.0) {
        local_348 = (Library *)local_548._8_8_;
        local_358 = local_538[0];
        local_4c0 = local_538[1];
        dVar37 = sqrt(dVar37);
      }
      else {
        dVar37 = SQRT(dVar37);
        local_348 = (Library *)local_548._8_8_;
        local_358 = local_538[0];
        local_4c0 = local_538[1];
      }
      local_4b8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((double)local_358 * (double)local_518 - (double)_Stack_520._M_pi * (double)local_4c0);
      apLStack_4b0[0] =
           (Library *)
           ((double)local_4c0 * (double)local_538[2] - (double)local_518 * (double)local_348);
      apLStack_4b0[1] =
           (Library *)
           ((double)local_348 * (double)_Stack_520._M_pi - (double)local_538[2] * (double)local_358)
      ;
      local_448.write_.shared_alloc_.alloc = (Alloc *)local_4b8._M_pi;
      local_448.write_.shared_alloc_.direct_ptr = apLStack_4b0[0];
      local_438[0] = apLStack_4b0[1];
      dVar47 = (double)local_4b8._M_pi * (double)local_4b8._M_pi;
      lVar28 = 1;
      do {
        dVar47 = dVar47 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar28] *
                          (double)(&local_4b8)[lVar28]._M_pi;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_4c0 = apLStack_4b0[0];
      local_358 = (Library *)local_4b8._M_pi;
      local_348 = apLStack_4b0[1];
      if (dVar47 < 0.0) {
        local_168 = (Library *)_Stack_520._M_pi;
        local_320 = local_538[2];
        local_328 = local_518;
        dVar47 = sqrt(dVar47);
        _Var43._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168;
        pLVar42 = local_320;
        pLVar45 = local_328;
      }
      else {
        dVar47 = SQRT(dVar47);
        _Var43._M_pi = _Stack_520._M_pi;
        pLVar42 = local_538[2];
        pLVar45 = local_518;
      }
      if (dVar37 < dVar47) {
        local_458 = local_358;
        uStack_450 = 0;
        local_3b8 = local_4c0;
        uStack_3b0 = 0;
        local_338 = local_348;
        p_Stack_330 = (_Base_ptr)0x0;
        dVar37 = dVar47;
      }
      pLVar46 = (Library *)
                ((double)uVar18 * (double)pLVar45 + (double)local_298 * (double)_Var43._M_pi);
      pLVar45 = (Library *)((double)uVar6 * (double)pLVar42 + local_2a8 * (double)pLVar45);
      apLStack_4b0[1] =
           (Library *)
           ((double)local_4f8 * (double)_Var43._M_pi + (double)local_1d8._0_8_ * (double)pLVar42);
      local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar46;
      apLStack_4b0[0] = pLVar45;
      local_448.write_.shared_alloc_.alloc = (Alloc *)pLVar46;
      local_448.write_.shared_alloc_.direct_ptr = pLVar45;
      local_438[0] = apLStack_4b0[1];
      dVar47 = (double)pLVar46 * (double)pLVar46;
      lVar28 = 1;
      do {
        dVar47 = dVar47 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar28] *
                          (double)(&local_4b8)[lVar28]._M_pi;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      if (dVar47 < 0.0) {
        local_4f8 = apLStack_4b0[1];
        dVar47 = sqrt(dVar47);
        pLVar42 = local_4f8;
      }
      else {
        dVar47 = SQRT(dVar47);
        pLVar42 = apLStack_4b0[1];
      }
      uVar35 = SUB84(local_3e8,0);
      uVar36 = (undefined4)((ulong)local_3e8 >> 0x20);
      if (dVar37 < dVar47) {
        local_458 = pLVar46;
        uStack_450 = 0;
        local_3b8 = pLVar45;
        uStack_3b0 = 0;
        local_338 = pLVar42;
        p_Stack_330 = p_Stack_4f0;
        dVar37 = dVar47;
      }
      if (dVar37 <= 1e-10) {
        uVar18 = 0xbf;
        goto LAB_002e818a;
      }
      local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458;
      apLStack_4b0[0] = local_3b8;
      apLStack_4b0[1] = local_338;
      lVar28 = 0;
      do {
        (&local_448.write_.shared_alloc_.alloc)[lVar28] =
             (Alloc *)((double)(&local_4b8)[lVar28]._M_pi / dVar37);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      *(Alloc **)((long)&local_3a8 + lVar27 * 0x18) = local_448.write_.shared_alloc_.alloc;
      *(void **)((long)&local_3a8 + lVar27 * 0x18 + 8) = local_448.write_.shared_alloc_.direct_ptr;
      (&local_398)[lVar27 * 3] = local_438[0];
      local_4e8[lVar27] = local_158;
      lVar27 = lVar27 + 1;
      uVar40 = (undefined4)local_2b8;
      uVar41 = local_2b8._4_4_;
    } while (lVar27 != 3);
  }
  lVar27 = 9;
  pSVar26 = &local_3a8.shared_alloc_;
  puVar20 = (undefined8 *)local_558;
  for (; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar20 = pSVar26->alloc;
    pSVar26 = (SharedAlloc *)((long)pSVar26 + ((ulong)bVar34 * 0xfffffffffffffffe + 1) * 8);
    puVar20 = puVar20 + (ulong)bVar34 * -2 + 1;
  }
  local_500 = local_4e8[2];
  local_510._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8[0];
  pLStack_508 = local_4e8[1];
  puVar20 = (undefined8 *)local_558;
  p_Var14 = &local_4b8;
  for (lVar27 = 9; lVar27 != 0; lVar27 = lVar27 + -1) {
    p_Var14->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar20;
    puVar20 = puVar20 + (ulong)bVar34 * -2 + 1;
    p_Var14 = p_Var14 + (ulong)bVar34 * -2 + 1;
  }
  local_398 = local_4e8[2];
  local_3a8.shared_alloc_.alloc = (Alloc *)local_4e8[0];
  local_3a8.shared_alloc_.direct_ptr = local_4e8[1];
  lVar27 = 0;
  do {
    local_470[lVar27] =
         (Alloc *)((double)(&local_3a8.shared_alloc_.alloc)[lVar27] *
                  (double)CONCAT44(uVar41,uVar40));
    lVar27 = lVar27 + 1;
    pRVar31 = local_1c0;
  } while (lVar27 != 3);
LAB_002e7e28:
  local_228[2] = (Library *)local_470[2];
  local_228[0] = (Library *)local_470[0];
  local_228[1] = (Library *)local_470[1];
  p_Var14 = &local_4b8;
  puVar20 = (undefined8 *)local_558;
  for (lVar27 = 9; pAVar4 = local_288, lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar20 = p_Var14->_M_pi;
    p_Var14 = p_Var14 + (ulong)bVar34 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar34 * -2 + 1;
  }
  iVar16 = 0;
  lVar27 = 1;
  do {
    iVar9 = (int)lVar27;
    if ((double)local_228[iVar16] < (double)local_228[lVar27] ||
        (double)local_228[iVar16] == (double)local_228[lVar27]) {
      iVar9 = iVar16;
    }
    iVar16 = iVar9;
    lVar27 = lVar27 + 1;
  } while (lVar27 != 3);
  lVar27 = (long)iVar16 * 0x18;
  pdVar13 = (double *)(local_558 + lVar27);
  local_308[2] = (Library *)*(undefined8 *)(local_548 + lVar27);
  local_308[0] = (Library *)*pdVar13;
  local_308[1] = (Library *)*(undefined8 *)(local_548 + lVar27 + -8);
  lVar28 = 0;
  uVar19 = 0;
  do {
    uVar19 = uVar19 | (uint)(0.0 <= (double)local_308[lVar28]) << ((byte)lVar28 & 0x1f);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 3);
  if (uVar19 < (~uVar19 & 7)) {
    local_398 = *(Library **)(local_548 + lVar27);
    local_3a8.shared_alloc_.alloc = (Alloc *)*pdVar13;
    local_3a8.shared_alloc_.direct_ptr = *(Library **)(local_548 + lVar27 + -8);
    lVar27 = 0;
    do {
      local_98[lVar27] = -(double)(&local_3a8.shared_alloc_.alloc)[lVar27];
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
  }
  else {
    local_98[2] = *(double *)(local_548 + lVar27);
    local_98[0] = *pdVar13;
    local_98[1] = *(double *)(local_548 + lVar27 + -8);
  }
  (local_1b8->super_Few<double,_3>).array_[2] = local_98[2];
  (local_1b8->super_Few<double,_3>).array_[0] = local_98[0];
  (local_1b8->super_Few<double,_3>).array_[1] = local_98[1];
  if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
    piVar1 = &local_288->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_288);
      operator_delete(pAVar4,0x48);
    }
  }
  pLVar42 = local_278;
  if (((ulong)local_278 & 7) == 0 && local_278 != (Library *)0x0) {
    pCVar2 = &local_278->self_;
    *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         -1;
    if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == 0
       ) {
      Alloc::~Alloc((Alloc *)local_278);
      operator_delete(pLVar42,0x48);
    }
  }
  if (this_00 != (Library *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  pAVar4 = local_a8;
  local_138.write_.shared_alloc_.alloc =
       (Alloc *)(comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_138.write_.shared_alloc_.direct_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.write_.shared_alloc_.direct_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.write_.shared_alloc_.direct_ptr)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_138.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.write_.shared_alloc_.direct_ptr)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_138.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
    }
  }
  local_1a8.write_.shared_alloc_.alloc = (pRVar31->write_).shared_alloc_.alloc;
  if (((ulong)local_1a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8.write_.shared_alloc_.alloc =
           (Alloc *)((local_1a8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1a8.write_.shared_alloc_.alloc)->use_count =
           (local_1a8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1a8.write_.shared_alloc_.direct_ptr = (pRVar31->write_).shared_alloc_.direct_ptr;
  local_148 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)(local_148->size * 8 + 1);
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  local_140 = (masses->write_).shared_alloc_.direct_ptr;
  center_00.super_Few<double,_3>.array_[1] = local_80.super_Few<double,_3>.array_[1];
  center_00.super_Few<double,_3>.array_[0] = local_80.super_Few<double,_3>.array_[0];
  center_00.super_Few<double,_3>.array_[2] = local_80.super_Few<double,_3>.array_[2];
  RVar50 = anon_unknown_0::mark_bisection_internal
                     ((CommPtr *)local_a8,&local_138,&local_1a8,local_a0,
                      (Few<double,_3>)*(Few<double,_3> *)(local_1b8->super_Few<double,_3>).array_,
                      center_00,local_1b0);
  pAVar8 = local_148;
  pvVar21 = RVar50.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    piVar1 = &local_148->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148);
      operator_delete(pAVar8,0x48);
      pvVar21 = extraout_RDX;
    }
  }
  pAVar8 = local_1a8.write_.shared_alloc_.alloc;
  if (((ulong)local_1a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1a8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
      pvVar21 = extraout_RDX_00;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.write_.shared_alloc_.direct_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_138.write_.shared_alloc_.direct_ptr);
    pvVar21 = extraout_RDX_01;
  }
  RVar50.write_.shared_alloc_.direct_ptr = pvVar21;
  RVar50.write_.shared_alloc_.alloc = pAVar4;
  return (Read<signed_char>)RVar50.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_bisection(
    CommPtr comm, Reals coords, Reals masses, Real tolerance, Vector<3>& axis) {
  OMEGA_H_CHECK(coords.size() == masses.size() * 3);
  auto total_mass = repro_sum(comm, masses);
  auto center = get_center(comm, coords, masses, total_mass);
  axis = get_axis(comm, coords, masses, center);
  return mark_bisection_internal(
      comm, coords, masses, tolerance, axis, center, total_mass);
}